

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Value __thiscall Catch::RunContext::actOnCurrentResult(RunContext *this,AssertionResult *result)

{
  size_t sVar1;
  Value VVar2;
  uint uVar3;
  int iVar4;
  
  std::__cxx11::string::_M_assign((string *)&this->m_lastResult);
  std::__cxx11::string::_M_assign((string *)&(this->m_lastResult).m_info.lineInfo);
  (this->m_lastResult).m_info.lineInfo.line = (result->m_info).lineInfo.line;
  std::__cxx11::string::_M_assign((string *)&(this->m_lastResult).m_info.capturedExpression);
  (this->m_lastResult).m_info.resultDisposition = (result->m_info).resultDisposition;
  std::__cxx11::string::_M_assign((string *)&(this->m_lastResult).m_resultData);
  std::__cxx11::string::_M_assign((string *)&(this->m_lastResult).m_resultData.message);
  (this->m_lastResult).m_resultData.resultType = (result->m_resultData).resultType;
  (*(this->super_IResultCapture)._vptr_IResultCapture[2])(this,&this->m_lastResult);
  VVar2 = None;
  if ((((this->m_lastResult).m_resultData.resultType & FailureBit) != Ok) &&
     (((this->m_lastResult).m_info.resultDisposition & SuppressFail) == Normal)) {
    uVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[7])(this);
    sVar1 = (this->m_totals).assertions.failed;
    iVar4 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
    VVar2 = (uVar3 & 0xff) * 2 + (uint)(sVar1 == (long)iVar4) * 4 + Failed;
  }
  return VVar2;
}

Assistant:

ResultAction::Value actOnCurrentResult( AssertionResult const& result ) {
            m_lastResult = result;
            assertionEnded( m_lastResult );

            ResultAction::Value action = ResultAction::None;

            if( !m_lastResult.isOk() ) {
                action = ResultAction::Failed;
                if( shouldDebugBreak() )
                    action = (ResultAction::Value)( action | ResultAction::Debug );
                if( aborting() )
                    action = (ResultAction::Value)( action | ResultAction::Abort );
            }
            return action;
        }